

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O1

Geometry * rw::Geometry::create(int32 numVerts,int32 numTris,uint32 flags)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Geometry *this;
  Triangle *pTVar5;
  TexCoords *pTVar6;
  long lVar7;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 30"
  ;
  this = (Geometry *)(*Engine::memfuncs)((long)s_plglist,0x3000f);
  if (this == (Geometry *)0x0) {
    create();
    this = (Geometry *)0x0;
  }
  else {
    numAllocated = numAllocated + 1;
    (this->object).type = '\b';
    (this->object).subType = '\0';
    (this->object).flags = '\0';
    (this->object).privateFlags = '\0';
    (this->object).parent = (void *)0x0;
    this->flags = flags & 0xff00ffff;
    uVar4 = flags >> 0x10 & 0xff;
    if (uVar4 == 0) {
      uVar4 = 1;
      if ((flags & 4) == 0) {
        uVar4 = flags >> 6 & 2;
      }
    }
    this->numTexCoordSets = uVar4;
    this->numTriangles = numTris;
    this->numVertices = numVerts;
    this->colors = (RGBA *)0x0;
    this->texCoords[0] = (TexCoords *)0x0;
    this->texCoords[1] = (TexCoords *)0x0;
    this->texCoords[2] = (TexCoords *)0x0;
    this->texCoords[3] = (TexCoords *)0x0;
    this->texCoords[4] = (TexCoords *)0x0;
    this->texCoords[5] = (TexCoords *)0x0;
    this->texCoords[6] = (TexCoords *)0x0;
    this->texCoords[7] = (TexCoords *)0x0;
    this->triangles = (Triangle *)0x0;
    if ((flags >> 0x18 & 1) == 0) {
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 58"
      ;
      pTVar5 = (Triangle *)
               (*DAT_00149de8)((long)((numVerts * 4 & (int)(flags << 0x1c) >> 0x1f) +
                                     (numVerts * this->numTexCoordSets + numTris) * 8),0x3000f);
      this->triangles = pTVar5;
      iVar1 = this->numTriangles;
      pTVar6 = (TexCoords *)(pTVar5 + iVar1);
      if (((this->flags & 8) != 0) && ((long)this->numVertices != 0)) {
        this->colors = (RGBA *)pTVar6;
        pTVar6 = (TexCoords *)(&pTVar6->u + this->numVertices);
      }
      iVar2 = this->numVertices;
      if (((long)iVar2 != 0) && (iVar3 = this->numTexCoordSets, 0 < (long)iVar3)) {
        lVar7 = 0;
        do {
          this->texCoords[lVar7] = pTVar6;
          pTVar6 = pTVar6 + iVar2;
          lVar7 = lVar7 + 1;
        } while (iVar3 != lVar7);
      }
      if (0 < iVar1) {
        pTVar5 = this->triangles;
        lVar7 = 0;
        do {
          pTVar5[lVar7].matId = 0xffff;
          lVar7 = lVar7 + 1;
        } while (iVar1 != lVar7);
      }
    }
    this->numMorphTargets = 0;
    this->morphTargets = (MorphTarget *)0x0;
    addMorphTargets(this,1);
    this->lockedSinceInst = 0;
    (this->matList).materials = (Material **)0x0;
    (this->matList).numMaterials = 0;
    (this->matList).space = 0;
    this->meshHeader = (MeshHeader *)0x0;
    this->instData = (InstanceDataHeader *)0x0;
    this->refCount = 1;
    PluginList::construct((PluginList *)&s_plglist,this);
  }
  return this;
}

Assistant:

Geometry*
Geometry::create(int32 numVerts, int32 numTris, uint32 flags)
{
	Geometry *geo = (Geometry*)rwMalloc(s_plglist.size, MEMDUR_EVENT | ID_GEOMETRY);
	if(geo == nil){
		RWERROR((ERR_ALLOC, s_plglist.size));
		return nil;
	}
	numAllocated++;
	geo->object.init(Geometry::ID, 0);
	geo->flags = flags & 0xFF00FFFF;
	geo->numTexCoordSets = (flags & 0xFF0000) >> 16;
	if(geo->numTexCoordSets == 0)
		geo->numTexCoordSets = (geo->flags & TEXTURED)  ? 1 :
		                       (geo->flags & TEXTURED2) ? 2 : 0;
	geo->numTriangles = numTris;
	geo->numVertices = numVerts;

	geo->colors = nil;
	for(int32 i = 0; i < 8; i++)
		geo->texCoords[i] = nil;
	geo->triangles = nil;
	// Allocate all attributes at once. The triangle pointer
	// will hold the first address (even when there are no triangles)
	// so we can free easily.
	if(!(geo->flags & NATIVE)){
		int32 sz = geo->numTriangles*sizeof(Triangle);
		if(geo->flags & PRELIT)
			sz += geo->numVertices*sizeof(RGBA);
		sz += geo->numTexCoordSets*geo->numVertices*sizeof(TexCoords);

		uint8 *data = (uint8*)rwNew(sz, MEMDUR_EVENT | ID_GEOMETRY);
		geo->triangles = (Triangle*)data;
		data += geo->numTriangles*sizeof(Triangle);
		if(geo->flags & PRELIT && geo->numVertices){
			geo->colors = (RGBA*)data;
			data += geo->numVertices*sizeof(RGBA);
		}
		if(geo->numVertices)
			for(int32 i = 0; i < geo->numTexCoordSets; i++){
				geo->texCoords[i] = (TexCoords*)data;
				data += geo->numVertices*sizeof(TexCoords);
			}

		// init triangles
		for(int32 i = 0; i < geo->numTriangles; i++)
			geo->triangles[i].matId = 0xFFFF;
	}
	geo->numMorphTargets = 0;
	geo->morphTargets = nil;
	geo->addMorphTargets(1);

	geo->matList.init();
	geo->lockedSinceInst = 0;
	geo->meshHeader = nil;
	geo->instData = nil;
	geo->refCount = 1;

	s_plglist.construct(geo);
	return geo;
}